

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lua-bson.c
# Opt level: O3

void append_one(bson *bs,lua_State *L,char *key,size_t sz)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  size_t n;
  int *__src;
  uint8_t *puVar7;
  char *pcVar8;
  int iVar9;
  ulong uVar10;
  _Bool isarray;
  size_t __n;
  int iVar11;
  ulong uVar12;
  lua_Number lVar13;
  anon_union_8_2_94730066 v;
  size_t len;
  size_t len_1;
  ulong local_50;
  size_t local_48;
  int local_40;
  undefined4 uStack_3c;
  uint8_t *local_38;
  
  iVar3 = lua_type(L,-1);
  switch(iVar3) {
  case 1:
    iVar11 = bs->size;
    iVar9 = bs->cap;
    iVar3 = iVar11 + 1;
    if (iVar11 < iVar9) {
      puVar7 = bs->ptr;
    }
    else {
      do {
        iVar9 = iVar9 * 2;
      } while (iVar9 <= iVar3);
      bs->cap = iVar9;
      if (bs->ptr == bs->buffer) {
        puVar7 = (uint8_t *)malloc((long)iVar9);
        bs->ptr = puVar7;
        memcpy(puVar7,bs->buffer,(long)iVar11);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
        bs->ptr = puVar7;
        iVar11 = bs->size;
        iVar3 = iVar11 + 1;
      }
    }
    bs->size = iVar3;
    puVar7[iVar11] = '\b';
    write_string(bs,key,sz);
    iVar4 = lua_toboolean(L,-1);
    iVar11 = bs->size;
    iVar9 = bs->cap;
    iVar3 = iVar11 + 1;
    if (iVar11 < iVar9) {
      puVar7 = bs->ptr;
    }
    else {
      do {
        iVar9 = iVar9 * 2;
      } while (iVar9 <= iVar3);
      bs->cap = iVar9;
      if (bs->ptr == bs->buffer) {
        puVar7 = (uint8_t *)malloc((long)iVar9);
        bs->ptr = puVar7;
        memcpy(puVar7,bs->buffer,(long)iVar11);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
        bs->ptr = puVar7;
        iVar11 = bs->size;
        iVar3 = iVar11 + 1;
      }
    }
    bs->size = iVar3;
    puVar7[iVar11] = (uint8_t)iVar4;
    break;
  default:
    pcVar5 = lua_typename(L,iVar3);
    luaL_error(L,"Invalid value type : %s",pcVar5);
  case 3:
    iVar3 = lua_isinteger(L,-1);
    if (iVar3 == 0) {
      lVar13 = lua_tonumberx(L,-1,(int *)0x0);
      iVar11 = bs->size;
      iVar9 = bs->cap;
      iVar3 = iVar11 + 1;
      if (iVar11 < iVar9) {
        puVar7 = bs->ptr;
      }
      else {
        do {
          iVar9 = iVar9 * 2;
        } while (iVar9 <= iVar3);
        bs->cap = iVar9;
        if (bs->ptr == bs->buffer) {
          local_48 = (long)iVar11;
          puVar7 = (uint8_t *)malloc((long)iVar9);
          bs->ptr = puVar7;
          memcpy(puVar7,bs->buffer,local_48);
        }
        else {
          puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
          bs->ptr = puVar7;
          iVar11 = bs->size;
          iVar3 = iVar11 + 1;
        }
      }
      bs->size = iVar3;
      puVar7[iVar11] = '\x01';
      write_string(bs,key,sz);
      iVar3 = bs->size;
      iVar9 = iVar3 + 8;
      iVar11 = bs->cap;
      if (iVar11 < iVar9) {
        do {
          iVar11 = iVar11 * 2;
        } while (iVar11 <= iVar9);
        bs->cap = iVar11;
        if (bs->ptr == bs->buffer) {
          puVar7 = (uint8_t *)malloc((long)iVar11);
          bs->ptr = puVar7;
          memcpy(puVar7,bs->buffer,(long)iVar3);
        }
        else {
          puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar11);
          bs->ptr = puVar7;
        }
      }
      uVar6 = 0xfffffffffffffff8;
      do {
        uVar6 = uVar6 + 8;
        iVar3 = bs->size;
        bs->size = iVar3 + 1;
        bs->ptr[iVar3] = (uint8_t)((ulong)lVar13 >> ((byte)uVar6 & 0x3f));
      } while (uVar6 < 0x38);
    }
    else {
      uVar6 = lua_tointegerx(L,-1,(int *)0x0);
      iVar11 = bs->size;
      iVar9 = bs->cap;
      iVar3 = iVar11 + 1;
      if ((long)(int)uVar6 == uVar6) {
        if (iVar11 < iVar9) {
          puVar7 = bs->ptr;
        }
        else {
          do {
            iVar9 = iVar9 * 2;
          } while (iVar9 <= iVar3);
          bs->cap = iVar9;
          if (bs->ptr == bs->buffer) {
            local_48 = (long)iVar11;
            puVar7 = (uint8_t *)malloc((long)iVar9);
            bs->ptr = puVar7;
            memcpy(puVar7,bs->buffer,local_48);
          }
          else {
            puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
            bs->ptr = puVar7;
            iVar11 = bs->size;
            iVar3 = iVar11 + 1;
          }
        }
        bs->size = iVar3;
        puVar7[iVar11] = '\x10';
        write_string(bs,key,sz);
        iVar11 = bs->size;
        iVar3 = bs->cap;
        if (iVar3 < iVar11 + 4) {
          do {
            iVar3 = iVar3 * 2;
          } while (iVar3 <= iVar11 + 4);
          bs->cap = iVar3;
          if (bs->ptr == bs->buffer) {
            puVar7 = (uint8_t *)malloc((long)iVar3);
            bs->ptr = puVar7;
            memcpy(puVar7,bs->buffer,(long)iVar11);
          }
          else {
            puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar3);
            bs->ptr = puVar7;
            iVar11 = bs->size;
          }
        }
        else {
          puVar7 = bs->ptr;
        }
        bs->size = iVar11 + 1;
        puVar7[iVar11] = (uint8_t)uVar6;
        iVar3 = bs->size;
        bs->size = iVar3 + 1;
        bs->ptr[iVar3] = (uint8_t)(uVar6 >> 8);
        iVar3 = bs->size;
        bs->size = iVar3 + 1;
        bs->ptr[iVar3] = (uint8_t)(uVar6 >> 0x10);
        iVar3 = bs->size;
        bs->size = iVar3 + 1;
        bs->ptr[iVar3] = (uint8_t)(uVar6 >> 0x18);
      }
      else {
        if (iVar11 < iVar9) {
          puVar7 = bs->ptr;
        }
        else {
          do {
            iVar9 = iVar9 * 2;
          } while (iVar9 <= iVar3);
          bs->cap = iVar9;
          if (bs->ptr == bs->buffer) {
            local_48 = (long)iVar11;
            puVar7 = (uint8_t *)malloc((long)iVar9);
            bs->ptr = puVar7;
            memcpy(puVar7,bs->buffer,local_48);
          }
          else {
            puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
            bs->ptr = puVar7;
            iVar11 = bs->size;
            iVar3 = iVar11 + 1;
          }
        }
        bs->size = iVar3;
        puVar7[iVar11] = '\x12';
        write_string(bs,key,sz);
        iVar3 = bs->size;
        iVar9 = iVar3 + 8;
        iVar11 = bs->cap;
        if (iVar11 < iVar9) {
          do {
            iVar11 = iVar11 * 2;
          } while (iVar11 <= iVar9);
          bs->cap = iVar11;
          if (bs->ptr == bs->buffer) {
            puVar7 = (uint8_t *)malloc((long)iVar11);
            bs->ptr = puVar7;
            memcpy(puVar7,bs->buffer,(long)iVar3);
          }
          else {
            puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar11);
            bs->ptr = puVar7;
          }
        }
        uVar10 = 0xfffffffffffffff8;
        do {
          uVar10 = uVar10 + 8;
          iVar3 = bs->size;
          bs->size = iVar3 + 1;
          bs->ptr[iVar3] = (uint8_t)(uVar6 >> ((byte)uVar10 & 0x3f));
        } while (uVar10 < 0x38);
      }
    }
    break;
  case 4:
    pcVar5 = lua_tolstring(L,-1,&local_50);
    if ((local_50 < 2) || (*pcVar5 != '\0')) {
      pcVar5 = lua_tolstring(L,-1,(size_t *)&local_40);
      iVar11 = bs->size;
      iVar9 = bs->cap;
      iVar3 = iVar11 + 1;
      if (iVar11 < iVar9) {
        puVar7 = bs->ptr;
      }
      else {
        do {
          iVar9 = iVar9 * 2;
        } while (iVar9 <= iVar3);
        bs->cap = iVar9;
        if (bs->ptr == bs->buffer) {
          puVar7 = (uint8_t *)malloc((long)iVar9);
          bs->ptr = puVar7;
          memcpy(puVar7,bs->buffer,(long)iVar11);
        }
        else {
          puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
          bs->ptr = puVar7;
          iVar11 = bs->size;
          iVar3 = iVar11 + 1;
        }
      }
      bs->size = iVar3;
      puVar7[iVar11] = '\x02';
      write_string(bs,key,sz);
      __n = (size_t)bs->size;
      iVar11 = bs->size + 4;
      iVar3 = bs->cap;
      if (iVar3 < iVar11) {
        do {
          iVar3 = iVar3 * 2;
        } while (iVar3 <= iVar11);
        bs->cap = iVar3;
        if (bs->ptr == bs->buffer) {
          puVar7 = (uint8_t *)malloc((long)iVar3);
          bs->ptr = puVar7;
          memcpy(puVar7,bs->buffer,__n);
        }
        else {
          puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar3);
          bs->ptr = puVar7;
          iVar11 = bs->size + 4;
        }
      }
      bs->size = iVar11;
      write_string(bs,pcVar5,CONCAT44(uStack_3c,local_40));
      local_40 = local_40 + 1;
      bs->ptr[__n] = (uint8_t)local_40;
      bs->ptr[__n + 1] = (uint8_t)((uint)local_40 >> 8);
      bs->ptr[__n + 2] = (uint8_t)((uint)local_40 >> 0x10);
      bs->ptr[__n + 3] = (uint8_t)((uint)local_40 >> 0x18);
      return;
    }
    bVar1 = pcVar5[1];
    iVar11 = bs->size;
    iVar9 = bs->cap;
    iVar3 = iVar11 + 1;
    if (iVar11 < iVar9) {
      puVar7 = bs->ptr;
    }
    else {
      do {
        iVar9 = iVar9 * 2;
      } while (iVar9 <= iVar3);
      bs->cap = iVar9;
      if (bs->ptr == bs->buffer) {
        local_48 = (long)iVar11;
        local_38 = bs->buffer;
        puVar7 = (uint8_t *)malloc((long)iVar9);
        bs->ptr = puVar7;
        memcpy(puVar7,local_38,local_48);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
        bs->ptr = puVar7;
        iVar11 = bs->size;
        iVar3 = iVar11 + 1;
      }
    }
    bs->size = iVar3;
    puVar7[iVar11] = bVar1;
    write_string(bs,key,sz);
    switch(bVar1) {
    case 5:
      write_binary(bs,pcVar5 + 2,local_50 - 2);
      return;
    case 7:
      if (local_50 != 0xe) {
        luaL_error(L,"Invalid object id %s",pcVar5 + 2);
      }
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
      bson_reserve(bs,(int)local_50 + -2);
      memcpy(bs->ptr + bs->size,pcVar5 + 2,local_50 - 2);
      bs->size = (int)local_50 + bs->size + -2;
      return;
    case 9:
      if (local_50 == 6) {
        write_int64(bs,(ulong)*(uint *)(pcVar5 + 2) * 1000);
        return;
      }
      luaL_error(L,"Invalid date");
    case 10:
      return;
    case 0xb:
      goto switchD_0011b2d3_caseD_b;
    case 0x11:
      if (local_50 == 10) {
        write_int32(bs,*(int32_t *)(pcVar5 + 2));
        write_int32(bs,*(int32_t *)(pcVar5 + 6));
        return;
      }
      luaL_error(L,"Invalid timestamp");
    default:
      if (bVar1 == 0x7f) {
        return;
      }
      if (bVar1 == 0xff) {
        return;
      }
    case 6:
    case 8:
    case 0x10:
      luaL_error(L,"Invalid subtype %d",(ulong)bVar1);
    }
  case 5:
    n = lua_rawlen(L,-1);
    if (n != 0) {
      lua_pushinteger(L,n);
      iVar3 = lua_next(L,-2);
      if (iVar3 == 0) {
        iVar11 = bs->size;
        iVar9 = bs->cap;
        iVar3 = iVar11 + 1;
        if (iVar11 < iVar9) {
          puVar7 = bs->ptr;
        }
        else {
          do {
            iVar9 = iVar9 * 2;
          } while (iVar9 <= iVar3);
          bs->cap = iVar9;
          if (bs->ptr == bs->buffer) {
            puVar7 = (uint8_t *)malloc((long)iVar9);
            bs->ptr = puVar7;
            memcpy(puVar7,bs->buffer,(long)iVar11);
          }
          else {
            puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
            bs->ptr = puVar7;
            iVar11 = bs->size;
            iVar3 = iVar11 + 1;
          }
        }
        isarray = true;
        uVar2 = '\x04';
        goto LAB_0011b236;
      }
      lua_settop(L,-3);
    }
    iVar11 = bs->size;
    iVar9 = bs->cap;
    iVar3 = iVar11 + 1;
    if (iVar11 < iVar9) {
      puVar7 = bs->ptr;
    }
    else {
      do {
        iVar9 = iVar9 * 2;
      } while (iVar9 <= iVar3);
      bs->cap = iVar9;
      if (bs->ptr == bs->buffer) {
        puVar7 = (uint8_t *)malloc((long)iVar9);
        bs->ptr = puVar7;
        memcpy(puVar7,bs->buffer,(long)iVar11);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
        bs->ptr = puVar7;
        iVar11 = bs->size;
        iVar3 = iVar11 + 1;
      }
    }
    uVar2 = '\x03';
    isarray = false;
LAB_0011b236:
    bs->size = iVar3;
    puVar7[iVar11] = uVar2;
    write_string(bs,key,sz);
    pack_dict(L,bs,isarray);
    return;
  case 7:
    iVar11 = bs->size;
    iVar9 = bs->cap;
    iVar3 = iVar11 + 1;
    if (iVar11 < iVar9) {
      puVar7 = bs->ptr;
    }
    else {
      do {
        iVar9 = iVar9 * 2;
      } while (iVar9 <= iVar3);
      bs->cap = iVar9;
      if (bs->ptr == bs->buffer) {
        puVar7 = (uint8_t *)malloc((long)iVar9);
        bs->ptr = puVar7;
        memcpy(puVar7,bs->buffer,(long)iVar11);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar9);
        bs->ptr = puVar7;
        iVar11 = bs->size;
        iVar3 = iVar11 + 1;
      }
    }
    bs->size = iVar3;
    puVar7[iVar11] = '\x03';
    write_string(bs,key,sz);
    __src = (int *)lua_touserdata(L,-1);
    iVar3 = *__src;
    iVar9 = bs->size;
    iVar11 = bs->cap;
    if (iVar11 < iVar9 + iVar3) {
      do {
        iVar11 = iVar11 * 2;
      } while (iVar11 <= iVar9 + iVar3);
      bs->cap = iVar11;
      if (bs->ptr == bs->buffer) {
        puVar7 = (uint8_t *)malloc((long)iVar11);
        bs->ptr = puVar7;
        memcpy(puVar7,bs->buffer,(long)iVar9);
      }
      else {
        puVar7 = (uint8_t *)realloc(bs->ptr,(long)iVar11);
        bs->ptr = puVar7;
        iVar9 = bs->size;
      }
    }
    else {
      puVar7 = bs->ptr;
    }
    memcpy(puVar7 + iVar9,__src,(long)iVar3);
    bs->size = bs->size + iVar3;
  }
  return;
switchD_0011b2d3_caseD_b:
  uVar6 = local_50 - 3;
  if (uVar6 == 0) {
    uVar10 = 0;
  }
  else {
    pcVar8 = pcVar5 + (local_50 - 2);
    uVar12 = 0;
    do {
      uVar10 = uVar12;
      if (*pcVar8 == '\0') break;
      uVar12 = uVar12 + 1;
      pcVar8 = pcVar8 + -1;
      uVar10 = uVar6;
    } while (uVar6 != uVar12);
  }
  local_50 = uVar6;
  write_string(bs,pcVar5 + 2,uVar6 + ~uVar10);
  write_string(bs,pcVar5 + 2 + (local_50 - uVar10),uVar10);
  return;
}

Assistant:

static void
append_one(struct bson *bs, lua_State *L, const char *key, size_t sz) {
	int vt = lua_type(L,-1);
	switch(vt) {
	case LUA_TNUMBER:
		append_number(bs, L, key, sz);
		break;
	case LUA_TUSERDATA: {
		append_key(bs, BSON_DOCUMENT, key, sz);
		int32_t * doc = lua_touserdata(L,-1);
		int32_t sz = *doc;
		bson_reserve(bs,sz);
		memcpy(bs->ptr + bs->size, doc, sz);
		bs->size += sz;
		break;
	}
	case LUA_TSTRING: {
		size_t len;
		const char * str = lua_tolstring(L,-1,&len);
		if (len > 1 && str[0]==0) {
			int subt = (uint8_t)str[1];
			append_key(bs, subt, key, sz);
			switch(subt) {
			case BSON_BINARY:
				write_binary(bs, str+2, len-2);
				break;
			case BSON_OBJECTID:
				if (len != 2+12) {
					luaL_error(L, "Invalid object id %s", str+2);
				}
				// go though
			case BSON_JSCODE:
			case BSON_DBPOINTER:
			case BSON_SYMBOL:
			case BSON_CODEWS:
				bson_reserve(bs,len-2);
				memcpy(bs->ptr + bs->size, str+2, len-2);
				bs->size += len-2;
				break;
			case BSON_DATE: {
				if (len != 2+4) {
					luaL_error(L, "Invalid date");
				}
				const uint32_t * ts = (const uint32_t *)(str + 2);
				int64_t v = (int64_t)*ts * 1000;
				write_int64(bs, v);
				break;
			}
			case BSON_TIMESTAMP: {
				if (len != 2+8) {
					luaL_error(L, "Invalid timestamp");
				}
				const uint32_t * inc = (const uint32_t *)(str + 2);
				const uint32_t * ts = (const uint32_t *)(str + 6);
				write_int32(bs, *inc);
				write_int32(bs, *ts);
				break;
			}
			case BSON_REGEX: {
				str+=2;
				len-=3;
				size_t i;
				for (i=0;i<len;i++) {
					if (str[len-i-1]==0) {
						break;
					}
				}
				write_string(bs, str, len-i-1);
				write_string(bs, str + len-i, i);
				break;
			}
			case BSON_MINKEY:
			case BSON_MAXKEY:
			case BSON_NULL:
				break;
			default:
				luaL_error(L,"Invalid subtype %d", subt);
			}
		} else {
			size_t len;
			const char * str = lua_tolstring(L,-1,&len);
			append_key(bs, BSON_STRING, key, sz);
			int off = reserve_length(bs);
			write_string(bs, str, len);
			write_length(bs, len+1, off);		
		}
		break;
	}
	case LUA_TTABLE:
		append_table(bs, L, key, sz);
		break;
	case LUA_TBOOLEAN:
		append_key(bs, BSON_BOOLEAN, key, sz);
		write_byte(bs, lua_toboolean(L,-1));
		break;
	default:
		luaL_error(L, "Invalid value type : %s", lua_typename(L,vt));
	}
}